

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O3

uint64_t __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadAddress(CompilationUnitSizes *this,string_view *data)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t sVar3;
  
  uVar1 = data->_M_len;
  if (this->addr8_ == true) {
    if (uVar1 < 8) {
LAB_001b2b28:
      Throw("premature EOF reading fixed-length data",0x8d);
    }
    uVar2 = *(uint64_t *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 8);
    sVar3 = uVar1 - 8;
  }
  else {
    if (uVar1 < 4) goto LAB_001b2b28;
    uVar2 = (uint64_t)*(uint *)data->_M_str;
    data->_M_str = (char *)((long)data->_M_str + 4);
    sVar3 = uVar1 - 4;
  }
  data->_M_len = sVar3;
  return uVar2;
}

Assistant:

uint64_t ReadAddress(std::string_view* data) const {
    return addr8_ ? ReadFixed<uint64_t>(data) : ReadFixed<uint32_t>(data);
  }